

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvawatch.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  long lVar3;
  code *pcVar4;
  uint32_t *puVar5;
  __start_routine *__start_routine;
  uint32_t uVar6;
  char *pcVar7;
  uint64_t uVar8;
  size_t sStack_40;
  pthread_t thr;
  
  iVar1 = nva_init();
  if (iVar1 != 0) {
    pcVar7 = "PCI init failure!\n";
    sStack_40 = 0x12;
LAB_0010278b:
    fwrite(pcVar7,sStack_40,1,_stderr);
    return 1;
  }
  iVar1 = 0;
LAB_00102595:
  iVar2 = getopt(argc,argv,"tc:m:");
  if (iVar2 == 99) {
    pcVar7 = "%d";
    puVar5 = (uint32_t *)&cnum;
  }
  else {
    if (iVar2 != 0x6d) {
      if (iVar2 != -1) {
        if (iVar2 == 0x74) {
          iVar1 = 2 - (uint)(iVar1 == 0);
        }
        goto LAB_00102595;
      }
      if (cnum < nva_cardsnum) {
        if (_optind < argc) {
          __isoc99_sscanf(argv[_optind],"%x",&a);
          pcVar4 = t64watchfun;
          if (iVar1 == 1) {
            pcVar4 = twatchfun;
          }
          __start_routine = watchfun;
          if (iVar1 != 0) {
            __start_routine = pcVar4;
          }
          pthread_create(&thr,(pthread_attr_t *)0x0,__start_routine,(void *)0x0);
          uVar6 = 0;
          uVar8 = 0;
          do {
            while (get == put) {
              sched_yield();
            }
            lVar3 = (long)get;
            if (iVar1 == 0) {
              printf("%08x\n",(ulong)queue[lVar3]);
            }
            else if (iVar1 == 1) {
              printf("%08x[+%d]: %08x\n",(ulong)tqueue[lVar3],(ulong)(tqueue[get] - uVar6),
                     (ulong)queue[get]);
              uVar6 = tqueue[get];
            }
            else {
              printf("%016lu[+%lu]: %08x\n",tqueue64[lVar3],tqueue64[get] - uVar8,(ulong)queue[get])
              ;
              uVar8 = tqueue64[get];
            }
            get = (get + 1) % 0x100000;
          } while( true );
        }
        pcVar7 = "No address specified.\n";
        sStack_40 = 0x16;
      }
      else if (nva_cardsnum == 0) {
        pcVar7 = "No cards found.\n";
        sStack_40 = 0x10;
      }
      else {
        pcVar7 = "No such card.\n";
        sStack_40 = 0xe;
      }
      goto LAB_0010278b;
    }
    pcVar7 = "%x";
    puVar5 = &mask;
  }
  __isoc99_sscanf(_optarg,pcVar7,puVar5);
  goto LAB_00102595;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	unsigned int wanttime = 0;
	while ((c = getopt (argc, argv, "tc:m:")) != -1)
		switch (c) {
			case 't':
				wanttime++;
				if (wanttime > 2)
					wanttime = 2;
				break;
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
			case 'm':
				sscanf(optarg, "%x", &mask);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);

	pthread_t thr;
	if (wanttime == 0)
		pthread_create(&thr, 0, watchfun, 0);
	else if (wanttime == 1)
		pthread_create(&thr, 0, twatchfun, 0);
	else
		pthread_create(&thr, 0, t64watchfun, 0);

	uint32_t ptime = 0;
	uint64_t ptime64 = 0;
	while (1) {
		while (get == put)
			sched_yield();

		if (wanttime == 0)
			printf("%08x\n", queue[get]);
		else if (wanttime == 1) {
			printf("%08x[+%d]: %08x\n", tqueue[get], tqueue[get]-ptime, queue[get]);
			ptime = tqueue[get];
		} else {
			printf("%016"PRIu64"[+%"PRIu64"]: %08x\n", tqueue64[get], tqueue64[get]-ptime64, queue[get]);
			ptime64 = tqueue64[get];
		}

		get = (get + 1) % SZ;
	}
}